

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

UdpPortDeclSyntax * __thiscall slang::parsing::Parser::parseUdpPortDecl(Parser *this,bool *isReg)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *expr;
  EqualsValueClauseSyntax *initializer;
  IdentifierNameSyntax *pIVar3;
  undefined4 extraout_var;
  UdpInputPortDeclSyntax *pUVar4;
  Info *extraout_RDX;
  Info *src;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *attributes;
  AttrList AVar5;
  Token TVar6;
  Token TVar7;
  Token name;
  Token equals;
  pointer local_148;
  __extent_storage<18446744073709551615UL> local_140;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  long local_118;
  undefined8 uStack_110;
  size_t local_108;
  pointer local_100;
  size_t local_f8;
  Token local_f0;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> ports;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> local_68;
  
  AVar5 = parseAttributes(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
  local_148 = AVar5._M_ptr;
  local_140 = AVar5._M_extent._M_extent_value;
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,RegKeyword), bVar1)) {
    TVar6 = ParserBase::consumeIf(&this->super_ParserBase,OutputKeyword);
    TVar7 = ParserBase::consumeIf(&this->super_ParserBase,RegKeyword);
    name = ParserBase::expect(&this->super_ParserBase,Identifier);
    if ((TVar7.info == (Info *)0x0) || (*isReg = true, TVar6.info == (Info *)0x0)) {
      initializer = (EqualsValueClauseSyntax *)0x0;
    }
    else {
      bVar1 = ParserBase::peek(&this->super_ParserBase,Equals);
      if (bVar1) {
        equals = ParserBase::consume(&this->super_ParserBase);
        expr = parseExpression(this);
        initializer = slang::syntax::SyntaxFactory::equalsValueClause(&this->factory,equals,expr);
      }
      else {
        initializer = (EqualsValueClauseSyntax *)0x0;
      }
    }
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len =
         CONCAT44(ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._4_4_,1);
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[8] =
         (undefined1)local_140._M_extent_value;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[9] =
         local_140._M_extent_value._1_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[10] =
         local_140._M_extent_value._2_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xb] =
         local_140._M_extent_value._3_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xc] =
         local_140._M_extent_value._4_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xd] =
         local_140._M_extent_value._5_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xe] =
         local_140._M_extent_value._6_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xf] =
         local_140._M_extent_value._7_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_8_ = local_148;
    ports.stackBase[0] = (undefined1)local_140._M_extent_value;
    ports.stackBase[1] = local_140._M_extent_value._1_1_;
    ports.stackBase[2] = local_140._M_extent_value._2_1_;
    ports.stackBase[3] = local_140._M_extent_value._3_1_;
    ports.stackBase[4] = local_140._M_extent_value._4_1_;
    ports.stackBase[5] = local_140._M_extent_value._5_1_;
    ports.stackBase[6] = local_140._M_extent_value._6_1_;
    ports.stackBase[7] = local_140._M_extent_value._7_1_;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)&PTR_getChild_006a3268;
    local_f0 = name;
    pUVar4 = (UdpInputPortDeclSyntax *)
             slang::syntax::SyntaxFactory::udpOutputPortDecl
                       (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&ports,
                        TVar6,TVar7,name,initializer);
  }
  else {
    TVar6 = ParserBase::expect(&this->super_ParserBase,InputKeyword);
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
    ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
    while( true ) {
      TVar7 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pIVar3 = slang::syntax::SyntaxFactory::identifierName(&this->factory,TVar7);
      local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pIVar3;
      local_118._0_1_ = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_128._M_first);
      bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
      src = extraout_RDX;
      if (!bVar1) break;
      TVar7 = ParserBase::peek(&this->super_ParserBase,1);
      src = TVar7.info;
      if (TVar7.kind != Identifier) break;
      local_128._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase)
      ;
      local_118 = (ulong)local_118._1_7_ << 8;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_128._M_first);
    }
    local_128._8_4_ = 1;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = local_140._M_extent_value;
    local_100 = local_148;
    local_f8 = local_140._M_extent_value;
    local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a3268;
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (&ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
    local_68.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3c48;
    attributes = &local_128;
    pUVar4 = slang::syntax::SyntaxFactory::udpInputPortDecl
                       (&this->factory,
                        (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&attributes->_M_first,
                        TVar6,&local_68);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
              (&ports.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (EVP_PKEY_CTX *)&attributes->_M_first);
  }
  return &pUVar4->super_UdpPortDeclSyntax;
}

Assistant:

UdpPortDeclSyntax& Parser::parseUdpPortDecl(bool& isReg) {
    auto attrs = parseAttributes();

    if (peek(TokenKind::OutputKeyword) || peek(TokenKind::RegKeyword)) {
        auto output = consumeIf(TokenKind::OutputKeyword);
        auto reg = consumeIf(TokenKind::RegKeyword);
        auto name = expect(TokenKind::Identifier);

        if (reg)
            isReg = true;

        EqualsValueClauseSyntax* init = nullptr;
        if (output && reg && peek(TokenKind::Equals)) {
            auto equals = consume();
            init = &factory.equalsValueClause(equals, parseExpression());
        }

        return factory.udpOutputPortDecl(attrs, output, reg, name, init);
    }

    auto input = expect(TokenKind::InputKeyword);

    SmallVector<TokenOrSyntax, 4> ports;
    while (true) {
        auto name = expect(TokenKind::Identifier);
        ports.push_back(&factory.identifierName(name));

        if (!peek(TokenKind::Comma) || peek(1).kind != TokenKind::Identifier)
            break;

        ports.push_back(consume());
    }

    return factory.udpInputPortDecl(attrs, input, ports.copy(alloc));
}